

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# se.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *ip;
  int port;
  int device;
  int quality;
  
  ip = argv[1];
  port = atoi(argv[2]);
  device = atoi(argv[3]);
  quality = atoi(argv[4]);
  camera_fun(ip,port,device,quality);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
	char *ip=argv[1];
	int port = atoi(argv[2]);
	int device = atoi(argv[3]);
	int quality = atoi(argv[4]);
	 
	camera_fun(ip,port,device,quality);

    return 0;
}